

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoReportTopmost(Gia_IsoMan_t *p)

{
  Gia_Man_t *pGVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar9;
  int Counter;
  int nSize;
  int iBegin;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Gia_IsoMan_t *p_local;
  
  Gia_ManIncrementTravId(p->pGia);
  for (iBegin = 0; iVar3 = Vec_IntSize(p->vClasses), iBegin + 1 < iVar3; iBegin = iBegin + 2) {
    iVar3 = Vec_IntEntry(p->vClasses,iBegin);
    iVar4 = Vec_IntEntry(p->vClasses,iBegin + 1);
    for (nSize = 0; nSize < iVar4; nSize = nSize + 1) {
      pGVar1 = p->pGia;
      uVar6 = Gia_IsoGetItem(p,iVar3 + nSize);
      pGVar9 = Gia_ManObj(pGVar1,uVar6);
      iVar5 = Gia_ObjIsAnd(pGVar9);
      if (iVar5 == 0) {
        iVar5 = Gia_ObjIsRo(p->pGia,pGVar9);
        if (iVar5 != 0) {
          pGVar1 = p->pGia;
          pGVar9 = Gia_ObjRoToRi(p->pGia,pGVar9);
          pGVar9 = Gia_ObjFanin0(pGVar9);
          Gia_ObjSetTravIdCurrent(pGVar1,pGVar9);
        }
      }
      else {
        pGVar1 = p->pGia;
        pObj_00 = Gia_ObjFanin0(pGVar9);
        Gia_ObjSetTravIdCurrent(pGVar1,pObj_00);
        pGVar1 = p->pGia;
        pGVar9 = Gia_ObjFanin1(pGVar9);
        Gia_ObjSetTravIdCurrent(pGVar1,pGVar9);
      }
    }
  }
  iBegin = 0;
  do {
    iVar3 = Vec_IntSize(p->vClasses);
    if (iVar3 <= iBegin + 1) {
      return;
    }
    uVar6 = Vec_IntEntry(p->vClasses,iBegin);
    uVar7 = Vec_IntEntry(p->vClasses,iBegin + 1);
    for (nSize = 0; nSize < (int)uVar7; nSize = nSize + 1) {
      pGVar1 = p->pGia;
      uVar8 = Gia_IsoGetItem(p,uVar6 + nSize);
      pGVar9 = Gia_ManObj(pGVar1,uVar8);
      iVar3 = Gia_ObjIsTravIdCurrent(p->pGia,pGVar9);
      if (iVar3 == 0) {
        printf("%5d : ");
        uVar8 = Gia_ObjId(p->pGia,pGVar9);
        piVar2 = p->pLevels;
        iVar3 = Gia_ObjId(p->pGia,pGVar9);
        printf("Obj %6d : Level = %4d.  iBegin = %4d.  Size = %4d.\n",(ulong)uVar8,
               (ulong)(uint)piVar2[iVar3],(ulong)uVar6,(ulong)uVar7);
        break;
      }
    }
    iBegin = iBegin + 2;
  } while( true );
}

Assistant:

void Gia_IsoReportTopmost( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj;
    int i, k, iBegin, nSize, Counter = 0;
    // go through equivalence classes
    Gia_ManIncrementTravId( p->pGia );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
//        printf( "%d(%d) ", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p, iBegin+k) );
            if ( Gia_ObjIsAnd(pObj) )
            {
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin0(pObj) );
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin1(pObj) );
            }
            else if ( Gia_ObjIsRo(p->pGia, pObj) )
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)) );
        }
    }
//    printf( "\n" );

    // report non-labeled nodes
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p, iBegin+k) );
            if ( !Gia_ObjIsTravIdCurrent(p->pGia, pObj) )
            {
                printf( "%5d : ", ++Counter );
                printf( "Obj %6d : Level = %4d.  iBegin = %4d.  Size = %4d.\n", 
                    Gia_ObjId(p->pGia, pObj), p->pLevels[Gia_ObjId(p->pGia, pObj)], iBegin, nSize );
                break;
            }
        }
    }
}